

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std_error.h
# Opt level: O2

double __thiscall nodecpp::error::std_error_domain::log(std_error_domain *this,double __x)

{
  bool bVar1;
  LogLevel in_EDX;
  char *pcVar2;
  long in_RSI;
  double __x_00;
  double dVar3;
  double extraout_XMM0_Qa;
  string_ref sStack_38;
  
  bVar1 = impl::isDataStackInfo((StackInfo *)(in_RSI + 8));
  if (bVar1) {
    (*(this->super_error_domain)._vptr_error_domain[1])(&sStack_38,this);
    pcVar2 = "";
    if (sStack_38.str != (char *)0x0) {
      pcVar2 = sStack_38.str;
    }
    nodecpp::log::default_log::log<char_const*,char_const*>(in_EDX,"{} happened at",pcVar2);
    string_ref::release_str(&sStack_38);
    dVar3 = StackInfo::log((StackInfo *)(in_RSI + 8),__x_00);
  }
  else {
    (*(this->super_error_domain)._vptr_error_domain[1])(&sStack_38,this);
    pcVar2 = "";
    if (sStack_38.str != (char *)0x0) {
      pcVar2 = sStack_38.str;
    }
    nodecpp::log::default_log::log<char_const*,char_const*>(in_EDX,"{}",pcVar2);
    string_ref::release_str(&sStack_38);
    dVar3 = extraout_XMM0_Qa;
  }
  return dVar3;
}

Assistant:

virtual void log(error_value* value, log::LogLevel l ) const { 
			if ( ::nodecpp::impl::isDataStackInfo( value->stackInfo ) )
			{
				log::default_log::log( l, "{} happened at", value_to_message( value ).c_str() );
				value->stackInfo.log( l );
			}
			else
				log::default_log::log( l, "{}", value_to_message( value ).c_str() );
		}